

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRboStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::anon_unknown_1::RboComponentSizeDepthCase::test
          (RboComponentSizeDepthCase *this)

{
  CallLogWrapper *this_00;
  ostringstream *this_01;
  TestContext *this_02;
  bool bVar1;
  GLuint renderbufferID;
  StateQueryMemoryWriteGuard<int> state;
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  
  renderbufferID = 0;
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  glu::CallLogWrapper::glGenRenderbuffers(this_00,1,&renderbufferID);
  glu::CallLogWrapper::glBindRenderbuffer(this_00,0x8d41,renderbufferID);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glRenderbufferStorage(this_00,0x8d41,0x81a5,1,1);
  ApiCase::expectError(&this->super_ApiCase,0);
  checkRenderbufferComponentSize
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,-1
             ,-1,-1,-1,0x10,0);
  glu::CallLogWrapper::glRenderbufferStorage(this_00,0x8d41,0x8d48,1,1);
  ApiCase::expectError(&this->super_ApiCase,0);
  state.m_preguard = -0x21212122;
  state.m_value = -0x21212122;
  state.m_postguard = -0x21212122;
  glu::CallLogWrapper::glGetRenderbufferParameteriv(this_00,0x8d41,0x8d55,&state.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    (&state,(this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                            m_testCtx);
  if ((bVar1) && (state.m_value < 8)) {
    local_1a0._0_8_ =
         ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_01 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_01);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_01,"// ERROR: Expected greater or equal to 8; got ",0x2e);
    std::ostream::operator<<(this_01,state.m_value);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_01);
    std::ios_base::~ios_base(local_128);
    this_02 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    if (this_02->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(this_02,QP_TEST_RESULT_FAIL,"got invalid value");
    }
  }
  glu::CallLogWrapper::glDeleteRenderbuffers(this_00,1,&renderbufferID);
  return;
}

Assistant:

void test (void)
	{
		using tcu::TestLog;

		GLuint renderbufferID = 0;
		glGenRenderbuffers(1, &renderbufferID);
		glBindRenderbuffer(GL_RENDERBUFFER, renderbufferID);
		expectError(GL_NO_ERROR);

		const struct DepthFormat
		{
			GLenum	internalFormat;
			int		dbits;
			int		sbits;
		} requiredDepthFormats[] =
		{
			{ GL_DEPTH_COMPONENT16,		16, 0 },
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(requiredDepthFormats); ++ndx)
		{
			glRenderbufferStorage(GL_RENDERBUFFER, requiredDepthFormats[ndx].internalFormat, 1, 1);
			expectError(GL_NO_ERROR);

			checkRenderbufferComponentSize(m_testCtx, *this, -1, -1, -1, -1, requiredDepthFormats[ndx].dbits, requiredDepthFormats[ndx].sbits);
		}

		// STENCIL_INDEX8 is required, in that case sBits >= 8
		{
			glRenderbufferStorage(GL_RENDERBUFFER, GL_STENCIL_INDEX8, 1, 1);
			expectError(GL_NO_ERROR);

			StateQueryMemoryWriteGuard<GLint> state;
			glGetRenderbufferParameteriv(GL_RENDERBUFFER, GL_RENDERBUFFER_STENCIL_SIZE, &state);

			if (state.verifyValidity(m_testCtx) && state < 8)
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected greater or equal to 8; got " << state << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid value");
			}
		}

		glDeleteRenderbuffers(1, &renderbufferID);
	}